

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O2

shared_ptr<cali::ConfigSetImpl> __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::init_configset
          (RuntimeConfigImpl *this,char *name,config_entry_list_t *list)

{
  iterator __pos;
  ConfigSetImpl *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<cali::ConfigSetImpl> sVar2;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
  local_60;
  
  if (*(long *)(name + 0x90) == 0) {
    init_config_database((RuntimeConfigImpl *)name);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,(char *)list,(allocator<char> *)&local_80);
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>_>_>
                  *)(name + 0x68),&local_60.first);
  std::__cxx11::string::~string((string *)&local_60);
  if (__pos._M_node == (_Base_ptr)(name + 0x70)) {
    __p = (ConfigSetImpl *)operator_new(0x38);
    (__p->m_dict)._M_h._M_buckets = &(__p->m_dict)._M_h._M_single_bucket;
    (__p->m_dict)._M_h._M_bucket_count = 1;
    (__p->m_dict)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p->m_dict)._M_h._M_element_count = 0;
    (__p->m_dict)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->m_dict)._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->m_dict)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::__shared_ptr<cali::ConfigSetImpl,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cali::ConfigSetImpl,void>
              ((__shared_ptr<cali::ConfigSetImpl,(__gnu_cxx::_Lock_policy)2> *)this,__p);
    ConfigSetImpl::init(*(ConfigSetImpl **)this,(EVP_PKEY_CTX *)list);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,(char *)list,&local_81);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_&,_true>
              (&local_60,&local_80,(shared_ptr<cali::ConfigSetImpl> *)this);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
    ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,std::shared_ptr<cali::ConfigSetImpl>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cali::ConfigSetImpl>>>>
                *)(name + 0x68),(const_iterator)__pos._M_node,&local_60);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cali::ConfigSetImpl>_>
    ::~pair(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2> *)(__pos._M_node + 2))
    ;
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cali::ConfigSetImpl>)
         sVar2.super___shared_ptr<cali::ConfigSetImpl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ConfigSetImpl> init_configset(const char* name, const config_entry_list_t& list)
    {
        if (m_database.empty())
            init_config_database();

        auto it = m_database.find(name);

        if (it != m_database.end())
            return it->second;

        std::shared_ptr<ConfigSetImpl> ret { new ConfigSetImpl };

        ret->init(name, list, m_allow_read_env, m_combined_profile, m_top_profile);
        m_database.insert(it, make_pair(std::string(name), ret));

        return ret;
    }